

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
          *solver,bit_array *x)

{
  uint uVar1;
  int iVar2;
  bound_factor *pbVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  pointer ppVar9;
  _Head_base<0UL,_int_*,_false> _Var10;
  pointer ppVar11;
  ulong uVar12;
  ulong uVar13;
  sparse_matrix<int> *psVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  undefined1 auVar25 [64];
  _Head_base<0UL,_int_*,_false> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  bit_array *local_38;
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  
  ppVar9 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar9;
  }
  uVar1 = solver->m;
  ppVar11 = ppVar9;
  if ((ulong)uVar1 != 0) {
    uVar12 = 0;
    local_40._M_head_impl = (int *)this;
    local_38 = x;
    do {
      psVar14 = (sparse_matrix<int> *)&local_50;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_50,(int)solver + 0x10);
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
      auVar18._8_4_ = 0xffffffc0;
      auVar18._0_8_ = 0xffffffc0ffffffc0;
      auVar18._12_4_ = 0xffffffc0;
      auVar18._16_4_ = 0xffffffc0;
      auVar18._20_4_ = 0xffffffc0;
      auVar18._24_4_ = 0xffffffc0;
      auVar18._28_4_ = 0xffffffc0;
      auVar20 = vpbroadcastq_avx512f(ZEXT816(1));
      iVar24 = 0;
      if (local_48._M_head_impl != local_50._M_head_impl) {
        uVar13 = 0;
        auVar21 = vpbroadcastq_avx512f();
        auVar22 = vpsrlq_avx512f(auVar21,3);
        _Var10._M_head_impl = local_48._M_head_impl;
        auVar21 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar25 = auVar21;
          auVar21 = vpbroadcastq_avx512f();
          uVar13 = uVar13 + 8;
          auVar21 = vporq_avx512f(auVar21,auVar19);
          uVar6 = vpcmpuq_avx512f(auVar21,auVar22,2);
          auVar16 = vpgatherdd_avx512vl(*(undefined4 *)
                                         ((long)(_Var10._M_head_impl + 1) + (long)psVar14));
          bVar4 = (byte)uVar6;
          auVar17._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar16._4_4_;
          auVar17._0_4_ = (uint)(bVar4 & 1) * auVar16._0_4_;
          auVar17._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar16._8_4_;
          auVar17._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar16._12_4_;
          auVar17._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar16._16_4_;
          auVar17._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar16._20_4_;
          auVar17._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar16._24_4_;
          auVar17._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar16._28_4_;
          _Var10._M_head_impl = _Var10._M_head_impl + 0x10;
          auVar16 = vpsrad_avx2(auVar17,0x1f);
          auVar16 = vpsrld_avx2(auVar16,0x1a);
          auVar16 = vpaddd_avx2(auVar17,auVar16);
          vpsrad_avx2(auVar16,6);
          auVar16 = vpand_avx2(auVar18,auVar16);
          auVar16 = vpsubd_avx2(auVar17,auVar16);
          auVar21 = vpgatherdq_avx512f((int)*(local_38->super_bit_array_impl).m_data._M_t.
                                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl);
          auVar23._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar21._8_8_;
          auVar23._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
          auVar23._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar21._16_8_;
          auVar23._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar21._24_8_;
          auVar23._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar21._32_8_;
          auVar23._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar21._40_8_;
          auVar23._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar21._48_8_;
          auVar23._56_8_ = (uVar6 >> 7) * auVar21._56_8_;
          auVar21 = vpmovzxdq_avx512f(auVar16);
          auVar21 = vpsrlvq_avx512f(auVar23,auVar21);
          uVar7 = vptestmq_avx512f(auVar21,auVar20);
          auVar16 = vpmovm2d_avx512vl(uVar7);
          auVar16 = vpsubd_avx2(auVar25._0_32_,auVar16);
          auVar21 = ZEXT3264(auVar16);
        } while (((((long)local_50._M_head_impl - (long)local_48._M_head_impl) - 8U >> 3) + 8 &
                 0xfffffffffffffff8) != uVar13);
        auVar18 = vmovdqa32_avx512vl(auVar16);
        auVar15._0_4_ = (uint)(bVar4 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar25._0_4_
        ;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar15._4_4_ = (uint)bVar5 * auVar18._4_4_ | (uint)!bVar5 * auVar25._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar15._8_4_ = (uint)bVar5 * auVar18._8_4_ | (uint)!bVar5 * auVar25._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar15._12_4_ = (uint)bVar5 * auVar18._12_4_ | (uint)!bVar5 * auVar25._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar16._16_4_ = (uint)bVar5 * auVar18._16_4_ | (uint)!bVar5 * auVar25._16_4_;
        auVar16._0_16_ = auVar15;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar16._20_4_ = (uint)bVar5 * auVar18._20_4_ | (uint)!bVar5 * auVar25._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar16._24_4_ = (uint)bVar5 * auVar18._24_4_ | (uint)!bVar5 * auVar25._24_4_;
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar16._28_4_ = (uint)bVar5 * auVar18._28_4_ | (uint)!bVar5 * auVar25._28_4_;
        auVar15 = vphaddd_avx(auVar16._16_16_,auVar15);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        auVar15 = vphaddd_avx(auVar15,auVar15);
        iVar24 = auVar15._0_4_;
      }
      pbVar3 = (solver->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
               ._M_head_impl;
      iVar2 = pbVar3[uVar12].min;
      uVar8 = iVar2 - iVar24;
      if ((uVar8 != 0 && iVar24 <= iVar2) ||
         (iVar2 = pbVar3[uVar12].max, uVar8 = iVar24 - iVar2, uVar8 != 0 && iVar2 <= iVar24)) {
        local_50._M_head_impl = (int *)((ulong)uVar8 << 0x20 | uVar12);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_50);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
    ppVar11 = (((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               ((long)local_40._M_head_impl + 0x18))->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppVar9 = *(pointer *)((long)local_40._M_head_impl + 0x20);
  }
  return (int)((ulong)((long)ppVar9 - (long)ppVar11) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }